

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RateLimiterTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::utils::RateLimiter_testMaxBalance_Test::TestBody
          (RateLimiter_testMaxBalance_Test *this)

{
  bool bVar1;
  duration dVar2;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  AssertHelper aAStack_98 [8];
  Message local_90 [8];
  AssertionResult local_88 [2];
  AssertionResult gtest_ar_;
  RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock> local_58;
  
  dVar2.__r = std::chrono::_V2::steady_clock::now();
  local_58._creditsPerSecond = 0.1;
  local_58._maxBalance = 1.0;
  local_58._balance = 1.0;
  local_58._mutex.super___mutex_base._M_mutex.__align = 0;
  local_58._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  local_58._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  local_58._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_58._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  _ZN13jaegertracing5utils12_GLOBAL__N_111currentTimeE_0.__r = dVar2.__r;
  local_58._lastTick.__d.__r = (duration)(duration)dVar2.__r;
  gtest_ar_.success_ =
       RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                 (&local_58,0.0);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    _ZN13jaegertracing5utils12_GLOBAL__N_111currentTimeE_0.__r = dVar2.__r + 20000000000;
    gtest_ar_.success_ =
         RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                   (&local_58,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (gtest_ar_.success_) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      bVar1 = RateLimiter<jaegertracing::utils::(anonymous_namespace)::MockClock>::checkCredit
                        (&local_58,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      gtest_ar_.success_ = !bVar1;
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (gtest_ar_.success_) goto LAB_001e0df0;
      testing::Message::Message(local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (local_88,&gtest_ar_.success_,"limiter.checkCredit(1.0)","true");
      testing::internal::AssertHelper::AssertHelper
                (aAStack_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                 ,0x4c,(char *)local_88[0]._0_8_);
      testing::internal::AssertHelper::operator=(aAStack_98,local_90);
    }
    else {
      testing::Message::Message(local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (local_88,&gtest_ar_.success_,"limiter.checkCredit(1.0)","false");
      testing::internal::AssertHelper::AssertHelper
                (aAStack_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
                 ,0x4b,(char *)local_88[0]._0_8_);
      testing::internal::AssertHelper::operator=(aAStack_98,local_90);
    }
  }
  else {
    testing::Message::Message(local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_88,&gtest_ar_.success_,"limiter.checkCredit(1.0)","false");
    testing::internal::AssertHelper::AssertHelper
              (aAStack_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/utils/RateLimiterTest.cpp"
               ,0x48,(char *)local_88[0]._0_8_);
    testing::internal::AssertHelper::operator=(aAStack_98,local_90);
  }
  testing::internal::AssertHelper::~AssertHelper(aAStack_98);
  std::__cxx11::string::~string((string *)local_88);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_90);
LAB_001e0df0:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST(RateLimiter, testMaxBalance)
{
    const auto timestamp = std::chrono::steady_clock::now();
    currentTime = timestamp;
    RateLimiter<MockClock> limiter(0.1, 1.0);

    ASSERT_TRUE(limiter.checkCredit(1.0));

    currentTime = timestamp + std::chrono::seconds(20);
    ASSERT_TRUE(limiter.checkCredit(1.0));
    ASSERT_FALSE(limiter.checkCredit(1.0));
}